

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestDyndepBuildDiscoverNewOutputWithMultipleRules1::
RegisterBuildTestDyndepBuildDiscoverNewOutputWithMultipleRules1
          (RegisterBuildTestDyndepBuildDiscoverNewOutputWithMultipleRules1 *this)

{
  RegisterBuildTestDyndepBuildDiscoverNewOutputWithMultipleRules1 *this_local;
  
  RegisterTest(BuildTestDyndepBuildDiscoverNewOutputWithMultipleRules1::Create,
               "BuildTest.DyndepBuildDiscoverNewOutputWithMultipleRules1");
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuildDiscoverNewOutputWithMultipleRules1) {
  // Verify that a dyndep file can be built and loaded to discover
  // a new output of an edge that is already the output of another edge.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out $out.imp\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build out1 | out-twice.imp: touch in\n"
"build out2: touch in || dd\n"
"  dyndep = dd\n"
  ));
  fs_.Create("in", "");
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build out2 | out-twice.imp: dyndep\n"
);
  fs_.Tick();
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  EXPECT_EQ("", err);

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("multiple rules generate out-twice.imp", err);
}